

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O0

bool __thiscall pbrt::TriangleMesh::WritePLY(TriangleMesh *this,string *filename)

{
  p_ply name;
  p_ply in_RSI;
  int *in_RDI;
  char *unaff_retaddr;
  int i_1;
  int i;
  p_ply plyFile;
  long in_stack_ffffffffffffffc8;
  e_ply_type in_stack_ffffffffffffffd8;
  int iVar1;
  e_ply_type in_stack_ffffffffffffffdc;
  int iVar2;
  long in_stack_ffffffffffffffe0;
  int *value;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  bool bVar3;
  
  value = in_RDI;
  std::__cxx11::string::c_str();
  name = ply_create((char *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                    (e_ply_storage_mode)((ulong)value >> 0x20),(p_ply_error_cb)in_RSI,
                    in_stack_ffffffffffffffe0,
                    (void *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  if (name == (p_ply)0x0) {
    bVar3 = false;
  }
  else {
    ply_add_element((p_ply)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                    (char *)in_RDI,in_stack_ffffffffffffffc8);
    ply_add_scalar_property(in_RSI,(char *)name,in_stack_ffffffffffffffdc);
    ply_add_scalar_property(in_RSI,(char *)name,in_stack_ffffffffffffffdc);
    ply_add_scalar_property(in_RSI,(char *)name,in_stack_ffffffffffffffdc);
    if (*(long *)(in_RDI + 6) != 0) {
      ply_add_scalar_property(in_RSI,(char *)name,in_stack_ffffffffffffffdc);
      ply_add_scalar_property(in_RSI,(char *)name,in_stack_ffffffffffffffdc);
      ply_add_scalar_property(in_RSI,(char *)name,in_stack_ffffffffffffffdc);
    }
    if (*(long *)(in_RDI + 10) != 0) {
      ply_add_scalar_property(in_RSI,(char *)name,in_stack_ffffffffffffffdc);
      ply_add_scalar_property(in_RSI,(char *)name,in_stack_ffffffffffffffdc);
    }
    if (*(long *)(in_RDI + 8) != 0) {
      Warning<std::__cxx11::string_const&>
                (unaff_retaddr,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
    }
    ply_add_element((p_ply)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                    (char *)in_RDI,in_stack_ffffffffffffffc8);
    ply_add_list_property(in_RSI,(char *)name,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
    if (*(long *)(in_RDI + 0xc) != 0) {
      ply_add_scalar_property(in_RSI,(char *)name,in_stack_ffffffffffffffdc);
    }
    ply_write_header(in_RSI);
    for (iVar2 = 0; iVar2 < in_RDI[1]; iVar2 = iVar2 + 1) {
      ply_write((p_ply)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),(double)value);
      ply_write((p_ply)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),(double)value);
      ply_write((p_ply)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),(double)value);
      if (*(long *)(in_RDI + 6) != 0) {
        ply_write((p_ply)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),(double)value
                 );
        ply_write((p_ply)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),(double)value
                 );
        ply_write((p_ply)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),(double)value
                 );
      }
      if (*(long *)(in_RDI + 10) != 0) {
        ply_write((p_ply)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),(double)value
                 );
        ply_write((p_ply)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),(double)value
                 );
      }
    }
    for (iVar1 = 0; iVar1 < *in_RDI; iVar1 = iVar1 + 1) {
      ply_write((p_ply)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),(double)value);
      ply_write((p_ply)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),(double)value);
      ply_write((p_ply)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),(double)value);
      ply_write((p_ply)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),(double)value);
      if (*(long *)(in_RDI + 0xc) != 0) {
        ply_write((p_ply)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),(double)value
                 );
      }
    }
    ply_close((p_ply)CONCAT44(iVar2,iVar1));
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool TriangleMesh::WritePLY(const std::string &filename) const {
    p_ply plyFile =
        ply_create(filename.c_str(), PLY_DEFAULT, PlyErrorCallback, 0, nullptr);
    if (plyFile == nullptr)
        return false;

    ply_add_element(plyFile, "vertex", nVertices);
    ply_add_scalar_property(plyFile, "x", PLY_FLOAT);
    ply_add_scalar_property(plyFile, "y", PLY_FLOAT);
    ply_add_scalar_property(plyFile, "z", PLY_FLOAT);
    if (n != nullptr) {
        ply_add_scalar_property(plyFile, "nx", PLY_FLOAT);
        ply_add_scalar_property(plyFile, "ny", PLY_FLOAT);
        ply_add_scalar_property(plyFile, "nz", PLY_FLOAT);
    }
    if (uv != nullptr) {
        ply_add_scalar_property(plyFile, "u", PLY_FLOAT);
        ply_add_scalar_property(plyFile, "v", PLY_FLOAT);
    }
    if (s != nullptr)
        Warning(R"(%s: PLY mesh will be missing tangent vectors "S".)", filename);

    ply_add_element(plyFile, "face", nTriangles);
    ply_add_list_property(plyFile, "vertex_indices", PLY_UINT8, PLY_INT);
    if (faceIndices != nullptr)
        ply_add_scalar_property(plyFile, "face_indices", PLY_INT);

    ply_write_header(plyFile);

    for (int i = 0; i < nVertices; ++i) {
        ply_write(plyFile, p[i].x);
        ply_write(plyFile, p[i].y);
        ply_write(plyFile, p[i].z);
        if (n != nullptr) {
            ply_write(plyFile, n[i].x);
            ply_write(plyFile, n[i].y);
            ply_write(plyFile, n[i].z);
        }
        if (uv != nullptr) {
            ply_write(plyFile, uv[i].x);
            ply_write(plyFile, uv[i].y);
        }
    }

    for (int i = 0; i < nTriangles; ++i) {
        ply_write(plyFile, 3);
        ply_write(plyFile, vertexIndices[3 * i]);
        ply_write(plyFile, vertexIndices[3 * i + 1]);
        ply_write(plyFile, vertexIndices[3 * i + 2]);
        if (faceIndices != nullptr)
            ply_write(plyFile, faceIndices[i]);
    }

    ply_close(plyFile);
    return true;
}